

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_NUMBER::OEqual(_Type_NUMBER *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Number *this_01;
  Number *number;
  bool *pbVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar4;
  Variable VVar5;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_NUMBER *this_local;
  Variable *res;
  
  pOVar2 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  pOVar2 = Variable::operator->((Variable *)CONCAT71(in_register_00000009,in_CL));
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(this_00,(Type *)obj1);
  if (bVar1) {
    pOVar2 = Variable::operator->((Variable *)this);
    pbVar3 = Object::GetData<bool>(pOVar2);
    *pbVar3 = false;
    puVar4 = extraout_RDX;
  }
  else {
    pOVar2 = Variable::operator->(obj2);
    this_01 = Object::GetData<LiteScript::Number>(pOVar2);
    pOVar2 = Variable::operator->((Variable *)CONCAT71(in_register_00000009,in_CL));
    number = Object::GetData<LiteScript::Number>(pOVar2);
    bVar1 = Number::operator==(this_01,number);
    pOVar2 = Variable::operator->((Variable *)this);
    pbVar3 = Object::GetData<bool>(pOVar2);
    *pbVar3 = bVar1;
    puVar4 = extraout_RDX_00;
  }
  VVar5.nb_ref = puVar4;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OEqual(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    if (obj2->GetType() != *this)
        res->GetData<bool>() = false;
    else
        res->GetData<bool>() = (obj1->GetData<Number>() == obj2->GetData<Number>());
    return res;
}